

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

int je_mallctl(char *name,void *oldp,size_t *oldlenp,void *newp,size_t newlen)

{
  bool bVar1;
  _Bool _Var2;
  undefined8 *in_FS_OFFSET;
  tsd_t *tsd;
  void *in_stack_00000008;
  int ret;
  tsd_t *tsd_1;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 minimal;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_5c;
  
  minimal = (undefined1)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  _Var2 = malloc_initialized();
  if ((((_Var2 ^ 0xffU) & 1) == 0) || (_Var2 = malloc_init_hard(), !_Var2)) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    local_5c = 0xb;
  }
  else {
    if (*(char *)*in_FS_OFFSET != '\0') {
      tsd_fetch_slow((tsd_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (_Bool)minimal);
    }
    local_5c = ctl_byname((tsd_t *)oldp,(char *)oldlenp,newp,(size_t *)newlen,in_stack_00000008,
                          (size_t)tsd);
  }
  return local_5c;
}

Assistant:

JEMALLOC_NOTHROW
je_mallctl(const char *name, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	tsd_t *tsd;

	LOG("core.mallctl.entry", "name: %s", name);

	if (unlikely(malloc_init())) {
		LOG("core.mallctl.exit", "result: %d", EAGAIN);
		return EAGAIN;
	}

	tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));
	ret = ctl_byname(tsd, name, oldp, oldlenp, newp, newlen);
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.mallctl.exit", "result: %d", ret);
	return ret;
}